

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmap.cpp
# Opt level: O0

uint32_t Interpret(vector<bool,_std::allocator<bool>_> *asmap,
                  vector<bool,_std::allocator<bool>_> *ip)

{
  long lVar1;
  bool bVar2;
  const_reference cVar3;
  Instruction IVar4;
  uint32_t uVar5;
  _If_is_unsigned_integer<unsigned_int> _Var6;
  uint uVar7;
  size_type sVar8;
  ptrdiff_t pVar9;
  _Bit_iterator_base *in_RSI;
  long in_FS_OFFSET;
  uint32_t bit;
  Instruction opcode;
  uint32_t matchlen;
  uint32_t match;
  uint32_t jump;
  uint32_t default_asn;
  uint8_t bits;
  const_iterator endpos;
  const_iterator pos;
  uint in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  _Bit_iterator_base *in_stack_ffffffffffffff68;
  uint local_7c;
  uint32_t local_68;
  byte local_61;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<bool,_std::allocator<bool>_>::begin
            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff68);
  std::vector<bool,_std::allocator<bool>_>::end
            ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff68);
  sVar8 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff68);
  local_61 = (byte)sVar8;
  local_68 = 0;
  do {
    bVar2 = std::operator==(in_stack_ffffffffffffff68,
                            (_Bit_iterator_base *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
LAB_00f90be9:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/util/asmap.cpp"
                    ,0x81,"uint32_t Interpret(const std::vector<bool> &, const std::vector<bool> &)"
                   );
    }
    IVar4 = anon_unknown.dwarf_1d181a6::DecodeType
                      ((const_iterator *)in_stack_ffffffffffffff68,
                       (const_iterator *)
                       CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (IVar4 == RETURN) {
      local_68 = anon_unknown.dwarf_1d181a6::DecodeASN
                           ((const_iterator *)in_stack_ffffffffffffff68,
                            (const_iterator *)
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (local_68 != 0xffffffff) {
LAB_00f90c08:
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
          __stack_chk_fail();
        }
        return local_68;
      }
      goto LAB_00f90be9;
    }
    if (IVar4 == JUMP) {
      uVar5 = anon_unknown.dwarf_1d181a6::DecodeJump
                        ((const_iterator *)in_stack_ffffffffffffff68,
                         (const_iterator *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (((uVar5 == 0xffffffff) || (local_61 == 0)) ||
         (pVar9 = std::operator-(in_stack_ffffffffffffff68,
                                 (_Bit_iterator_base *)
                                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
         pVar9 <= (long)(ulong)uVar5)) goto LAB_00f90be9;
      std::vector<bool,_std::allocator<bool>_>::size
                ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff68);
      cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff68,
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (cVar3) {
        std::_Bit_const_iterator::operator+=
                  ((_Bit_const_iterator *)in_stack_ffffffffffffff68,
                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      }
      local_61 = local_61 - 1;
    }
    else if (IVar4 == MATCH) {
      uVar5 = anon_unknown.dwarf_1d181a6::DecodeMatch
                        ((const_iterator *)in_stack_ffffffffffffff68,
                         (const_iterator *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      if (uVar5 == 0xffffffff) goto LAB_00f90be9;
      _Var6 = std::bit_width<unsigned_int>(in_stack_ffffffffffffff5c);
      uVar7 = _Var6 - 1;
      if (local_61 < uVar7) goto LAB_00f90be9;
      for (local_7c = 0; local_7c < uVar7; local_7c = local_7c + 1) {
        in_stack_ffffffffffffff68 = in_RSI;
        std::vector<bool,_std::allocator<bool>_>::size
                  ((vector<bool,_std::allocator<bool>_> *)in_RSI);
        cVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff68,
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        if ((uint)cVar3 != (uVar5 >> (((char)uVar7 + -1) - (char)local_7c & 0x1fU) & 1))
        goto LAB_00f90c08;
        local_61 = local_61 - 1;
      }
    }
    else if ((IVar4 != DEFAULT) ||
            (local_68 = anon_unknown.dwarf_1d181a6::DecodeASN
                                  ((const_iterator *)in_stack_ffffffffffffff68,
                                   (const_iterator *)
                                   CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
            local_68 == 0xffffffff)) goto LAB_00f90be9;
  } while( true );
}

Assistant:

uint32_t Interpret(const std::vector<bool> &asmap, const std::vector<bool> &ip)
{
    std::vector<bool>::const_iterator pos = asmap.begin();
    const std::vector<bool>::const_iterator endpos = asmap.end();
    uint8_t bits = ip.size();
    uint32_t default_asn = 0;
    uint32_t jump, match, matchlen;
    Instruction opcode;
    while (pos != endpos) {
        opcode = DecodeType(pos, endpos);
        if (opcode == Instruction::RETURN) {
            default_asn = DecodeASN(pos, endpos);
            if (default_asn == INVALID) break; // ASN straddles EOF
            return default_asn;
        } else if (opcode == Instruction::JUMP) {
            jump = DecodeJump(pos, endpos);
            if (jump == INVALID) break; // Jump offset straddles EOF
            if (bits == 0) break; // No input bits left
            if (int64_t{jump} >= int64_t{endpos - pos}) break; // Jumping past EOF
            if (ip[ip.size() - bits]) {
                pos += jump;
            }
            bits--;
        } else if (opcode == Instruction::MATCH) {
            match = DecodeMatch(pos, endpos);
            if (match == INVALID) break; // Match bits straddle EOF
            matchlen = std::bit_width(match) - 1;
            if (bits < matchlen) break; // Not enough input bits
            for (uint32_t bit = 0; bit < matchlen; bit++) {
                if ((ip[ip.size() - bits]) != ((match >> (matchlen - 1 - bit)) & 1)) {
                    return default_asn;
                }
                bits--;
            }
        } else if (opcode == Instruction::DEFAULT) {
            default_asn = DecodeASN(pos, endpos);
            if (default_asn == INVALID) break; // ASN straddles EOF
        } else {
            break; // Instruction straddles EOF
        }
    }
    assert(false); // Reached EOF without RETURN, or aborted (see any of the breaks above) - should have been caught by SanityCheckASMap below
    return 0; // 0 is not a valid ASN
}